

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus ZydisDecoderEnableMode(ZydisDecoder *decoder,ZydisDecoderMode mode,ZyanBool enabled)

{
  ZyanBool enabled_local;
  ZydisDecoderMode mode_local;
  ZydisDecoder *decoder_local;
  
  if ((decoder == (ZydisDecoder *)0x0) || (ZYDIS_DECODER_MODE_MAX_VALUE < mode)) {
    decoder_local._4_4_ = 0x80100004;
  }
  else {
    if (enabled == '\0') {
      decoder->decoder_mode = (1 << ((byte)mode & 0x1f) ^ 0xffffffffU) & decoder->decoder_mode;
    }
    else {
      decoder->decoder_mode = 1 << ((byte)mode & 0x1f) | decoder->decoder_mode;
    }
    decoder_local._4_4_ = 0x100000;
  }
  return decoder_local._4_4_;
}

Assistant:

ZyanStatus ZydisDecoderEnableMode(ZydisDecoder* decoder, ZydisDecoderMode mode, ZyanBool enabled)
{
    if (!decoder || ((ZyanUSize)mode > ZYDIS_DECODER_MODE_MAX_VALUE))
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

#ifdef ZYDIS_MINIMAL_MODE
    if ((mode == ZYDIS_DECODER_MODE_MINIMAL) && !enabled)
    {
        return ZYAN_STATUS_INVALID_OPERATION;
    }
#endif

    if (enabled)
    {
        decoder->decoder_mode |= (1 << mode);
    }
    else
    {
        decoder->decoder_mode &= ~(1 << mode);
    }

    return ZYAN_STATUS_SUCCESS;
}